

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O1

void __thiscall
wabt::MemoryStream::MemoryStream
          (MemoryStream *this,
          unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> *buf,
          Stream *log_stream)

{
  (this->super_Stream).offset_ = 0;
  (this->super_Stream).result_.enum_ = Ok;
  (this->super_Stream).log_stream_ = log_stream;
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__MemoryStream_001a3678;
  (this->buf_)._M_t.
  super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
  super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl =
       (buf->_M_t).
       super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
       super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
       super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl;
  (buf->_M_t).super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
  super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl = (OutputBuffer *)0x0;
  return;
}

Assistant:

MemoryStream::MemoryStream(std::unique_ptr<OutputBuffer>&& buf,
                           Stream* log_stream)
    : Stream(log_stream), buf_(std::move(buf)) {}